

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

int xmlPythonFileCloseRaw(void *context)

{
  long *plVar1;
  int iVar2;
  
  if (context == (void *)0x0) {
    iVar2 = -1;
  }
  else {
    plVar1 = (long *)_PyObject_CallMethod_SizeT(context,"close","()");
    if ((plVar1 != (long *)0x0) && (*plVar1 = *plVar1 + -1, *plVar1 == 0)) {
      _Py_Dealloc(plVar1);
    }
    *(long *)context = *context + -1;
    iVar2 = 0;
    if (*context == 0) {
      _Py_Dealloc(context);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int
xmlPythonFileCloseRaw (void * context) {
    PyObject *file, *ret;

    file = (PyObject *) context;
    if (file == NULL) return(-1);
    ret = PyObject_CallMethod(file, (char *) "close", (char *) "()");
    if (ret != NULL) {
	Py_DECREF(ret);
    }
    Py_DECREF(file);
    return(0);
}